

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slidingwindows(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3ed) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ed;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    SlidingWindowsLayerParams::SlidingWindowsLayerParams(this_00.slidingwindows_);
    (this->layer_).slidingwindows_ = (SlidingWindowsLayerParams *)this_00;
  }
  return (SlidingWindowsLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SlidingWindowsLayerParams* NeuralNetworkLayer::mutable_slidingwindows() {
  if (!has_slidingwindows()) {
    clear_layer();
    set_has_slidingwindows();
    layer_.slidingwindows_ = new ::CoreML::Specification::SlidingWindowsLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.slidingWindows)
  return layer_.slidingwindows_;
}